

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitCloud.c
# Opt level: O3

CloudNode * Kit_TruthToCloud_rec(CloudManager *dd,uint *pTruth,int nVars,int nVarsAll)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  CloudNode *pCVar4;
  CloudNode *t;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int nVars_00;
  
  if (5 < nVars) {
    do {
      uVar7 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
      uVar5 = uVar7;
      do {
        if ((int)uVar5 < 1) {
          return dd->zero;
        }
        lVar2 = uVar5 - 1;
        uVar5 = uVar5 - 1;
      } while (pTruth[lVar2] == 0);
      do {
        if ((int)uVar7 < 1) {
          return dd->one;
        }
        lVar2 = uVar7 - 1;
        uVar7 = uVar7 - 1;
      } while (pTruth[lVar2] == 0xffffffff);
      nVars_00 = nVars + -1;
      uVar6 = 1 << ((char)nVars - 6U & 0x1f);
      uVar7 = (ulong)uVar6;
      uVar5 = uVar7;
      while (0 < (int)uVar5) {
        lVar2 = uVar5 - 1;
        lVar3 = uVar5 - 1;
        uVar5 = uVar5 - 1;
        if (pTruth[lVar2] != pTruth[(int)uVar6 + lVar3]) {
          goto LAB_00555106;
        }
      }
      bVar1 = 6 < nVars;
      nVars = nVars_00;
    } while (bVar1);
    nVars = 5;
  }
  pCVar4 = Kit_TruthToCloud5_rec(dd,*pTruth,nVars,nVarsAll);
  return pCVar4;
  while (lVar2 = uVar7 - 1, lVar3 = uVar7 - 1, uVar7 = uVar7 - 1,
        (pTruth[(int)uVar6 + lVar2] ^ pTruth[lVar3]) == 0xffffffff) {
LAB_00555106:
    if ((int)uVar7 < 1) {
      pCVar4 = Kit_TruthToCloud_rec(dd,pTruth,nVars_00,nVarsAll);
      t = (CloudNode *)((ulong)pCVar4 ^ 1);
      goto LAB_00555152;
    }
  }
  pCVar4 = Kit_TruthToCloud_rec(dd,pTruth,nVars_00,nVarsAll);
  t = Kit_TruthToCloud_rec(dd,pTruth + (int)uVar6,nVars_00,nVarsAll);
LAB_00555152:
  pCVar4 = Cloud_MakeNode(dd,nVarsAll - nVars,t,pCVar4);
  return pCVar4;
}

Assistant:

CloudNode * Kit_TruthToCloud_rec( CloudManager * dd, unsigned * pTruth, int nVars, int nVarsAll )
{
    CloudNode * pCof0, * pCof1;
    unsigned * pTruth0, * pTruth1;
    if ( nVars <= 5 )
        return Kit_TruthToCloud5_rec( dd, pTruth[0], nVars, nVarsAll );
    if ( Kit_TruthIsConst0(pTruth, nVars) )
        return dd->zero;
    if ( Kit_TruthIsConst1(pTruth, nVars) )
        return dd->one;
//    Count++;
    pTruth0 = pTruth;
    pTruth1 = pTruth + Kit_TruthWordNum(nVars-1);
    if ( Kit_TruthIsEqual( pTruth0, pTruth1, nVars - 1 ) )
        return Kit_TruthToCloud_rec( dd, pTruth0, nVars - 1, nVarsAll );
    if ( Kit_TruthIsOpposite( pTruth0, pTruth1, nVars - 1 ) )
    {
        pCof0 = Kit_TruthToCloud_rec( dd, pTruth0, nVars - 1, nVarsAll );
        pCof1 = Cloud_Not( pCof0 );
    }
    else
    {
        pCof0 = Kit_TruthToCloud_rec( dd, pTruth0, nVars - 1, nVarsAll );
        pCof1 = Kit_TruthToCloud_rec( dd, pTruth1, nVars - 1, nVarsAll );
    }
    return Cloud_MakeNode( dd, nVarsAll - nVars, pCof1, pCof0 );
}